

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O0

char * anon_unknown.dwarf_1233b::DefaultLogDir(void)

{
  char *pcVar1;
  char *env;
  char *name;
  char **__end1;
  char **__begin1;
  char *(*__range1) [2];
  char *names [2];
  char *local_10;
  
  __range1 = (char *(*) [2])anon_var_dwarf_1211e;
  names[0] = "TEST_TMPDIR";
  __end1 = (char **)&__range1;
  while( true ) {
    if (__end1 == names + 1) {
      local_10 = "";
      return local_10;
    }
    pcVar1 = getenv(*__end1);
    if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) break;
    __end1 = __end1 + 1;
  }
  return pcVar1;
}

Assistant:

static const char* DefaultLogDir() {
  constexpr const char* const names[]{"GOOGLE_LOG_DIR", "TEST_TMPDIR"};
  for (const char* const name : names) {
    const char* const env = std::getenv(name);
    if (env != nullptr && env[0] != '\0') {
      return env;
    }
  }
  return "";
}